

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O1

char __thiscall RandomBotStrategy::yesOrNo(RandomBotStrategy *this,StrategyContext context)

{
  char cVar1;
  pointer __first;
  uint uVar2;
  ulong uVar3;
  size_t __i;
  long lVar4;
  char *pcVar5;
  initializer_list<char> __l;
  vector<char,_std::allocator<char>_> optionVector;
  vector<char,_std::allocator<char>_> local_2740;
  random_device local_2728;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13a0;
  
  local_13a0._M_x[0] = CONCAT62(local_13a0._M_x[0]._2_6_,0x6e79);
  __l._M_len = 2;
  __l._M_array = (iterator)&local_13a0;
  std::vector<char,_std::allocator<char>_>::vector(&local_2740,__l,(allocator_type *)&local_2728);
  __first = local_2740.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start;
  std::random_device::random_device(&local_2728);
  uVar2 = std::random_device::_M_getval();
  local_13a0._M_x[0] = (unsigned_long)uVar2;
  lVar4 = 1;
  uVar3 = local_13a0._M_x[0];
  do {
    uVar3 = (ulong)(((uint)(uVar3 >> 0x1e) ^ (uint)uVar3) * 0x6c078965 + (int)lVar4);
    local_13a0._M_x[lVar4] = uVar3;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x270);
  local_13a0._M_p = 0x270;
  std::
  shuffle<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
            ((__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)__first,
             (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
             local_2740.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish,&local_13a0);
  std::random_device::_M_fini();
  if ((context < REINFORCE_CARD_COUNT) && ((0x441U >> (context & 0x1f) & 1) != 0)) {
    pcVar5 = " no, master";
    if (*local_2740.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_start == 'y') {
      pcVar5 = " yes, master";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,pcVar5,
               (ulong)(*local_2740.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start == 'y') + 0xb);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
    std::ostream::put(-0x80);
    std::ostream::flush();
  }
  cVar1 = *local_2740.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  operator_delete(local_2740.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start,
                  (long)local_2740.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage -
                  (long)local_2740.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start);
  return cVar1;
}

Assistant:

signed char RandomBotStrategy::yesOrNo(StrategyContext context) {
    std::vector<char> optionVector = {'y', 'n'};
    std::shuffle(optionVector.begin(), optionVector.end(), std::mt19937(std::random_device()())); // randomize the option vector
    switch((int) context) {
        case StrategyContext::ATTACK:
            std::cout << ((optionVector[0] == 'y') ? " yes, master" : " no, master") << std::endl;
            break;
        case StrategyContext::FORTIFY:
            std::cout << ((optionVector[0] == 'y') ? " yes, master" : " no, master") << std::endl;
            break;
        case StrategyContext::REINFORCE:
            std::cout << ((optionVector[0] == 'y') ? " yes, master" : " no, master") << std::endl;
            break;
    }
    return optionVector[0];
}